

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::PatchGetMethodNoFastPath
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,Var instance,PropertyId propertyId)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *scriptContext_00;
  ThreadContext *this;
  PropertyRecord *this_00;
  char16 *varName;
  JavascriptLibrary *this_01;
  undefined1 local_88 [8];
  PropertyValueInfo info;
  RecyclableObject *object;
  ScriptContext *scriptContext;
  PropertyId propertyId_local;
  Var instance_local;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  scriptContext_00 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  info.inlineCacheIndex = 0;
  info.isFunctionPIC = false;
  info.allowResizingPolymorphicInlineCache = false;
  info._62_2_ = 0;
  BVar2 = GetPropertyObject(instance,scriptContext_00,(RecyclableObject **)&info.inlineCacheIndex);
  if (BVar2 == 0) {
    this = ScriptContext::GetThreadContext(scriptContext_00);
    bVar1 = ThreadContext::RecordImplicitException(this);
    if (bVar1) {
      this_00 = ScriptContext::GetPropertyName(scriptContext_00,propertyId);
      varName = PropertyRecord::GetBuffer(this_00);
      JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5ec48,varName);
    }
    this_01 = ScriptContext::GetLibrary(scriptContext_00);
    functionBody_local =
         (FunctionBody *)JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  }
  else {
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_88);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_88,functionBody,inlineCache,inlineCacheIndex,true);
    functionBody_local =
         (FunctionBody *)
         PatchGetMethodFromObject
                   (instance,(RecyclableObject *)info._56_8_,propertyId,
                    (PropertyValueInfo *)local_88,scriptContext_00,false);
  }
  return functionBody_local;
}

Assistant:

Var JavascriptOperators::PatchGetMethodNoFastPath(FunctionBody *const functionBody, InlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId)
    {
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            // Don't error if we disabled implicit calls
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined,
                    scriptContext->GetPropertyName(propertyId)->GetBuffer());
            }
            else
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
        }

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, true);
        return Js::JavascriptOperators::PatchGetMethodFromObject(instance, object, propertyId, &info, scriptContext, false);
    }